

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O2

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>>
               (RepeatedPtrField<google::protobuf::FileDescriptorProto> *t)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)(t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar3 = (int)uVar4;
    if (iVar3 < 1) break;
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    bVar2 = FileDescriptorProto::IsInitialized
                      ((FileDescriptorProto *)
                       ((t->super_RepeatedPtrFieldBase).rep_)->elements[lVar1]);
  } while (bVar2);
  return iVar3 < 1;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}